

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

ps_seg_t * ps_lattice_seg_next(ps_seg_t *seg)

{
  dag_seg_t *itor;
  ps_seg_t *seg_local;
  
  *(short *)((long)&seg[1].search + 6) = *(short *)((long)&seg[1].search + 6) + 1;
  if ((int)*(short *)((long)&seg[1].search + 6) == *(short *)((long)&seg[1].search + 4) + 1) {
    ps_lattice_seg_free(seg);
    seg_local = (ps_seg_t *)0x0;
  }
  else {
    seg_local = seg;
    if (*(short *)((long)&seg[1].search + 6) == *(short *)((long)&seg[1].search + 4)) {
      ps_lattice_link2itor
                (seg,(ps_latlink_t *)
                     (&(seg[1].vt)->seg_next)[*(short *)((long)&seg[1].search + 6) + -1],1);
    }
    else {
      ps_lattice_link2itor
                (seg,(ps_latlink_t *)(&(seg[1].vt)->seg_next)[*(short *)((long)&seg[1].search + 6)],
                 0);
    }
  }
  return seg_local;
}

Assistant:

static ps_seg_t *
ps_lattice_seg_next(ps_seg_t *seg)
{
    dag_seg_t *itor = (dag_seg_t *)seg;

    ++itor->cur;
    if (itor->cur == itor->n_links + 1) {
        ps_lattice_seg_free(seg);
        return NULL;
    }
    else if (itor->cur == itor->n_links) {
        /* Reuse the last link but with the "to" node. */
        ps_lattice_link2itor(seg, itor->links[itor->cur - 1], TRUE);
    }
    else {
        ps_lattice_link2itor(seg, itor->links[itor->cur], FALSE);
    }

    return seg;
}